

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPUDPv6Transmitter::PollSocket(RTPUDPv6Transmitter *this,bool rtp)

{
  in6_addr ip;
  in6_addr srcip;
  undefined8 uVar1;
  uint8_t *puVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  ssize_t sVar6;
  RTPMemoryManager *pRVar7;
  RTPIPv6Address *this_00;
  RTPRawPacket *this_01;
  int memtype;
  RTPTime RStack_100c8;
  int iStack_100bc;
  int8_t iStack_100b5;
  int status_1;
  int8_t isset_1;
  undefined1 auStack_100a8 [24];
  uint8_t *datacopy;
  RTPIPv6Address *addr;
  RTPRawPacket *pack;
  uint32_t uStack_10078;
  undefined8 uStack_10074;
  bool bStack_10069;
  RTPTime RStack_10068;
  bool acceptdata;
  RTPTime curtime;
  int8_t iStack_10052;
  bool bStack_10051;
  int status;
  int8_t isset;
  bool dataavailable;
  sockaddr_in6 srcaddr;
  int sock;
  size_t len;
  char packetbuffer [65535];
  socklen_t local_20;
  int recvlen;
  uint fromlen;
  bool rtp_local;
  RTPUDPv6Transmitter *this_local;
  
  if (rtp) {
    srcaddr.sin6_addr.__in6_u.__u6_addr32[3] = this->rtpsock;
  }
  else {
    srcaddr.sin6_addr.__in6_u.__u6_addr32[3] = this->rtcpsock;
  }
  stack0xfffffffffffeffd0 = 0;
  recvlen._3_1_ = rtp;
  _fromlen = this;
  ioctl(srcaddr.sin6_addr.__in6_u.__u6_addr32[3],0x541b,&srcaddr.sin6_scope_id);
  if (stack0xfffffffffffeffd0 == 0) {
    iStack_10052 = '\0';
    RTPTime::RTPTime(&curtime,0.0);
    iVar5 = RTPSelect((SocketType *)(srcaddr.sin6_addr.__in6_u.__u6_addr32 + 3),&iStack_10052,1,
                      curtime);
    if (iVar5 < 0) {
      return iVar5;
    }
    bStack_10051 = iStack_10052 != '\0';
  }
  else {
    bStack_10051 = true;
  }
  do {
    if (bStack_10051 == false) {
      return 0;
    }
    RStack_10068 = RTPTime::CurrentTime();
    local_20 = 0x1c;
    sVar6 = recvfrom(srcaddr.sin6_addr.__in6_u.__u6_addr32[3],&len,0xffff,0,(sockaddr *)&status,
                     &local_20);
    iVar5 = (int)sVar6;
    if (0 < iVar5) {
      if (this->receivemode == AcceptAll) {
        bStack_10069 = true;
      }
      else {
        pack._4_2_ = srcaddr.sin6_family;
        pack._6_2_ = srcaddr.sin6_port;
        uStack_10078 = srcaddr.sin6_flowinfo;
        uStack_10074 = srcaddr.sin6_addr.__in6_u._0_8_;
        uVar4 = ntohs(status._2_2_);
        srcip.__in6_u._8_8_ = uStack_10074;
        srcip.__in6_u._0_2_ = pack._4_2_;
        srcip.__in6_u._2_2_ = pack._6_2_;
        srcip.__in6_u._4_4_ = uStack_10078;
        bStack_10069 = ShouldAcceptData(this,srcip,uVar4);
      }
      if (bStack_10069 != false) {
        pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        this_00 = (RTPIPv6Address *)operator_new(0x20,pRVar7,0x17);
        auStack_100a8._0_2_ = srcaddr.sin6_family;
        auStack_100a8._2_2_ = srcaddr.sin6_port;
        auStack_100a8._4_4_ = srcaddr.sin6_flowinfo;
        auStack_100a8._8_8_ = srcaddr.sin6_addr.__in6_u._0_8_;
        uVar4 = ntohs(status._2_2_);
        ip.__in6_u._8_8_ = auStack_100a8._8_8_;
        ip.__in6_u._0_8_ = auStack_100a8._0_8_;
        RTPIPv6Address::RTPIPv6Address(this_00,ip,uVar4);
        if (this_00 == (RTPIPv6Address *)0x0) {
          return -1;
        }
        datacopy = (uint8_t *)this_00;
        pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        memtype = 2;
        if ((recvlen._3_1_ & 1) != 0) {
          memtype = 1;
        }
        auStack_100a8._16_8_ = operator_new__((long)iVar5,pRVar7,memtype);
        puVar2 = datacopy;
        if ((uint8_t *)auStack_100a8._16_8_ == (uint8_t *)0x0) {
          pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDelete<jrtplib::RTPIPv6Address>((RTPIPv6Address *)puVar2,pRVar7);
          return -1;
        }
        memcpy((void *)auStack_100a8._16_8_,&len,(long)iVar5);
        pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        this_01 = (RTPRawPacket *)operator_new(0x38,pRVar7,0x1b);
        bVar3 = recvlen._3_1_;
        puVar2 = datacopy;
        uVar1 = auStack_100a8._16_8_;
        pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPRawPacket::RTPRawPacket
                  (this_01,(uint8_t *)uVar1,(long)iVar5,(RTPAddress *)puVar2,
                   &stack0xfffffffffffeff98,(bool)(bVar3 & 1),pRVar7);
        puVar2 = datacopy;
        addr = (RTPIPv6Address *)this_01;
        if (this_01 == (RTPRawPacket *)0x0) {
          pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDelete<jrtplib::RTPIPv6Address>((RTPIPv6Address *)puVar2,pRVar7);
          uVar1 = auStack_100a8._16_8_;
          pRVar7 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray((uint8_t *)uVar1,pRVar7);
          return -1;
        }
        std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
        push_back(&this->rawpacketlist,(value_type *)&addr);
      }
    }
    stack0xfffffffffffeffd0 = 0;
    ioctl(srcaddr.sin6_addr.__in6_u.__u6_addr32[3],0x541b,&srcaddr.sin6_scope_id);
    if (stack0xfffffffffffeffd0 == 0) {
      iStack_100b5 = '\0';
      RTPTime::RTPTime(&RStack_100c8,0.0);
      iStack_100bc = RTPSelect((SocketType *)(srcaddr.sin6_addr.__in6_u.__u6_addr32 + 3),
                               &iStack_100b5,1,RStack_100c8);
      if (iStack_100bc < 0) {
        return iStack_100bc;
      }
      bStack_10051 = iStack_100b5 != '\0';
    }
    else {
      bStack_10051 = true;
    }
  } while( true );
}

Assistant:

int RTPUDPv6Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV6TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in6 srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	len = 0;
	RTPIOCTL(sock,FIONREAD,&len);

	if (len <= 0) // make sure a packet of length zero is not queued
	{
		int8_t isset = 0;
		int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
		if (status < 0)
			return status;

		if (isset)
			dataavailable = true;
		else
			dataavailable = false;
	}
	else
		dataavailable = true;

	while (dataavailable)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		fromlen = sizeof(struct sockaddr_in6);
		recvlen = recvfrom(sock,packetbuffer,RTPUDPV6TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
		if (recvlen > 0)
		{
			bool acceptdata;

			// got data, process it
			if (receivemode == RTPTransmitter::AcceptAll)
				acceptdata = true;
			else
				acceptdata = ShouldAcceptData(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
			
			if (acceptdata)
			{
				RTPRawPacket *pack;
				RTPIPv6Address *addr;
				uint8_t *datacopy;

				addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
				if (addr == 0)
					return ERR_RTP_OUTOFMEM;
				datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
				if (datacopy == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				memcpy(datacopy,packetbuffer,recvlen);
				
				pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,rtp,GetMemoryManager());
				if (pack == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					RTPDeleteByteArray(datacopy,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				rawpacketlist.push_back(pack);	
			}
		}
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
	}
	return 0;
}